

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbiftad.cpp
# Opt level: O0

int __thiscall RandStrAltList::maxlen(RandStrAltList *this)

{
  int iVar1;
  long in_RDI;
  int l;
  RandStrNode *chi;
  int lmax;
  long *local_18;
  int local_c;
  
  local_c = 0;
  for (local_18 = *(long **)(in_RDI + 8); local_18 != (long *)0x0; local_18 = (long *)local_18[3]) {
    iVar1 = (**(code **)(*local_18 + 0x10))();
    if (local_c < iVar1) {
      local_c = iVar1;
    }
  }
  return local_c;
}

Assistant:

virtual int maxlen()
    {
        int lmax = 0;
        for (RandStrNode *chi = firstChild ; chi != 0 ; chi = chi->nextSibling)
        {
            int l = chi->maxlen();
            if (l > lmax)
                lmax = l;
        }

        return lmax;
    }